

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MainWindow.cpp
# Opt level: O1

void __thiscall MainWindow::on_actionTest_MIDI_Driver_toggled(MainWindow *this,bool checked)

{
  MidiDriver *pMVar1;
  TestMidiDriver *this_00;
  
  pMVar1 = this->testMidiDriver;
  if ((pMVar1 != (MidiDriver *)0x0) != checked) {
    if (pMVar1 == (MidiDriver *)0x0) {
      this_00 = (TestMidiDriver *)operator_new(0x68);
      TestMidiDriver::TestMidiDriver(this_00,this->master);
      this->testMidiDriver = (MidiDriver *)this_00;
      (**(code **)(*(long *)&this_00->super_MidiDriver + 0x68))(this_00);
      return;
    }
    (**(code **)(*(long *)pMVar1 + 0x70))();
    if (this->testMidiDriver != (MidiDriver *)0x0) {
      (**(code **)(*(long *)this->testMidiDriver + 0x20))();
    }
    this->testMidiDriver = (MidiDriver *)0x0;
  }
  return;
}

Assistant:

void MainWindow::on_actionTest_MIDI_Driver_toggled(bool checked) {
	bool running = testMidiDriver != NULL;
	if (running != checked) {
		if (running) {
			testMidiDriver->stop();
			delete testMidiDriver;
			testMidiDriver = NULL;
		} else {
			testMidiDriver = new TestMidiDriver(master);
			testMidiDriver->start();
		}
	}
}